

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::solveLleftForest
          (CLUFactor<double> *this,double *vec,int *param_3,double param_4)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  double *pdVar8;
  long in_RSI;
  long in_RDI;
  int *lbeg;
  int *lrow;
  int *lidx;
  int *idx;
  double *lval;
  double *val;
  double x;
  int end;
  int k;
  int j;
  int i;
  int *local_50;
  double *local_40;
  int local_28;
  int local_24;
  
  pdVar8 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x260a30);
  lVar4 = *(long *)(in_RDI + 0x78);
  lVar5 = *(long *)(in_RDI + 0x98);
  lVar6 = *(long *)(in_RDI + 0x90);
  iVar2 = *(int *)(in_RDI + 0x84);
  local_24 = *(int *)(in_RDI + 0x88);
  while (iVar7 = local_24, local_24 = iVar7 + -1, iVar2 <= local_24) {
    dVar1 = *(double *)(in_RSI + (long)*(int *)(lVar5 + (long)local_24 * 4) * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar3 = *(int *)(lVar6 + (long)local_24 * 4);
      local_50 = (int *)(lVar4 + (long)iVar3 * 4);
      local_40 = pdVar8 + iVar3;
      for (local_28 = *(int *)(lVar6 + (long)iVar7 * 4); iVar3 < local_28; local_28 = local_28 + -1)
      {
        *(double *)(in_RSI + (long)*local_50 * 8) =
             *(double *)(in_RSI + (long)*local_50 * 8) - dVar1 * *local_40;
        local_50 = local_50 + 1;
        local_40 = local_40 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R* vec, int* /* nonz */, R /* eps */)
{
   int i, j, k, end;
   R x;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
            vec[*idx++] -= x * (*val++);
      }
   }

   return 0;
}